

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CManageClient.cpp
# Opt level: O1

bool __thiscall CManageClient::IsInWhiteList(CManageClient *this,in_addr_t ip)

{
  uint uVar1;
  bool bVar2;
  uint index;
  ArrayIndex AVar3;
  in_addr_t iVar4;
  Value *pVVar5;
  string balst_ip;
  Value allow_ip;
  string local_78;
  Value local_58;
  
  bVar2 = Json::Value::empty(&this->m_Config);
  if (!bVar2) {
    pVVar5 = Json::Value::operator[](&this->m_Config,"white");
    Json::Value::Value(&local_58,pVVar5);
    uVar1 = 0;
    do {
      index = uVar1;
      AVar3 = Json::Value::size(&local_58);
      if (AVar3 <= index) {
        Json::Value::~Value(&local_58);
        return false;
      }
      pVVar5 = Json::Value::operator[](&local_58,index);
      Json::Value::asString_abi_cxx11_(&local_78,pVVar5);
      iVar4 = inet_addr(local_78._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      uVar1 = index + 1;
    } while (iVar4 != ip);
    Json::Value::~Value(&local_58);
    if (index < AVar3) {
      return true;
    }
  }
  return false;
}

Assistant:

bool CManageClient::IsInWhiteList(in_addr_t ip) const {
    if(!m_Config.empty()){
        Json::Value allow_ip = m_Config["white"];
        for(int i = 0;i < allow_ip.size();i++){
            string balst_ip = allow_ip[i].asString();
            if(ip == inet_addr(balst_ip.c_str())){
                return true;
            }
        }
    }
    return false;
}